

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lha_read_file_header_3(archive_read *a,lha *lha)

{
  uint16_t uVar1;
  uint32_t uVar2;
  wchar_t wVar3;
  void *pp;
  long in_RSI;
  archive *in_RDI;
  uint16_t header_crc;
  wchar_t err;
  size_t extdsize;
  uchar *p;
  lha *in_stack_00000030;
  archive_read *in_stack_00000038;
  size_t in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd2;
  undefined4 in_stack_ffffffffffffffd4;
  wchar_t local_4;
  
  pp = __archive_read_ahead
                 ((archive_read *)
                  CONCAT44(in_stack_ffffffffffffffd4,
                           CONCAT22(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0)),
                  in_stack_ffffffffffffffc8,(ssize_t *)0x151791);
  if (pp == (void *)0x0) {
    local_4 = truncated_error((archive_read *)0x1517a6);
  }
  else {
    uVar1 = archive_le16dec(pp);
    if (uVar1 == 4) {
      uVar2 = archive_le32dec((void *)((long)pp + 0x18));
      *(ulong *)(in_RSI + 0x20) = (ulong)uVar2;
      uVar2 = archive_le32dec((void *)((long)pp + 7));
      *(ulong *)(in_RSI + 0x30) = (ulong)uVar2;
      uVar2 = archive_le32dec((void *)((long)pp + 0xb));
      *(ulong *)(in_RSI + 0x38) = (ulong)uVar2;
      uVar2 = archive_le32dec((void *)((long)pp + 0xf));
      *(ulong *)(in_RSI + 0x58) = (ulong)uVar2;
      uVar1 = archive_le16dec((void *)((long)pp + 0x15));
      *(uint16_t *)(in_RSI + 0xc2) = uVar1;
      *(uint *)(in_RSI + 0x40) = *(uint *)(in_RSI + 0x40) | 8;
      if (0x1f < *(ulong *)(in_RSI + 0x20)) {
        uVar1 = lha_crc16(0,pp,0x1c);
        __archive_read_consume
                  ((archive_read *)
                   CONCAT44(in_stack_ffffffffffffffd4,CONCAT22(uVar1,in_stack_ffffffffffffffd0)),
                   in_stack_ffffffffffffffc8);
        wVar3 = lha_read_file_extended_header
                          (in_stack_00000038,in_stack_00000030,(uint16_t *)a,lha._4_4_,(size_t)p,
                           (size_t *)extdsize);
        if (wVar3 < L'\xffffffec') {
          return wVar3;
        }
        if (uVar1 == *(uint16_t *)(in_RSI + 0xc0)) {
          return wVar3;
        }
        archive_set_error(in_RDI,0x54,"LHa header CRC error");
        return L'\xffffffe2';
      }
    }
    archive_set_error(in_RDI,0x54,"Invalid LHa header");
    local_4 = L'\xffffffe2';
  }
  return local_4;
}

Assistant:

static int
lha_read_file_header_3(struct archive_read *a, struct lha *lha)
{
	const unsigned char *p;
	size_t extdsize;
	int err;
	uint16_t header_crc;

	if ((p = __archive_read_ahead(a, H3_FIXED_SIZE, NULL)) == NULL)
		return (truncated_error(a));

	if (archive_le16dec(p + H3_FIELD_LEN_OFFSET) != 4)
		goto invalid;
	lha->header_size =archive_le32dec(p + H3_HEADER_SIZE_OFFSET);
	lha->compsize = archive_le32dec(p + H3_COMP_SIZE_OFFSET);
	lha->origsize = archive_le32dec(p + H3_ORIG_SIZE_OFFSET);
	lha->mtime = archive_le32dec(p + H3_TIME_OFFSET);
	lha->crc = archive_le16dec(p + H3_CRC_OFFSET);
	lha->setflag |= CRC_IS_SET;

	if (lha->header_size < H3_FIXED_SIZE + 4)
		goto invalid;
	header_crc = lha_crc16(0, p, H3_FIXED_SIZE);
	__archive_read_consume(a, H3_FIXED_SIZE);

	/* Read extended headers */
	err = lha_read_file_extended_header(a, lha, &header_crc, 4,
		  lha->header_size - H3_FIXED_SIZE, &extdsize);
	if (err < ARCHIVE_WARN)
		return (err);

	if (header_crc != lha->header_crc) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "LHa header CRC error");
		return (ARCHIVE_FATAL);
	}
	return (err);
invalid:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Invalid LHa header");
	return (ARCHIVE_FATAL);
}